

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

NaVector * __thiscall NaVector::shift(NaVector *this,int iOffset)

{
  int iVar1;
  int in_ESI;
  NaVector *in_RDI;
  int i;
  int local_10;
  
  iVar1 = (*in_RDI->_vptr_NaVector[6])();
  if ((in_ESI < iVar1) &&
     (iVar1 = (*in_RDI->_vptr_NaVector[6])(),
     in_ESI != -iVar1 && SBORROW4(in_ESI,-iVar1) == in_ESI + iVar1 < 0)) {
    if (in_ESI < 1) {
      if (in_ESI < 0) {
        for (local_10 = 0; iVar1 = (*in_RDI->_vptr_NaVector[6])(), local_10 < iVar1 + in_ESI;
            local_10 = local_10 + 1) {
          in_RDI->pVect[local_10] = in_RDI->pVect[local_10 - in_ESI];
        }
        local_10 = (*in_RDI->_vptr_NaVector[6])();
        for (local_10 = local_10 + in_ESI; iVar1 = (*in_RDI->_vptr_NaVector[6])(), local_10 < iVar1;
            local_10 = local_10 + 1) {
          in_RDI->pVect[local_10] = 0.0;
        }
      }
    }
    else {
      local_10 = (*in_RDI->_vptr_NaVector[6])();
      local_10 = local_10 - in_ESI;
      while (local_10 = local_10 + -1, -1 < local_10) {
        in_RDI->pVect[local_10 + in_ESI] = in_RDI->pVect[local_10];
      }
      for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
        in_RDI->pVect[local_10] = 0.0;
      }
    }
  }
  else {
    (*in_RDI->_vptr_NaVector[0xd])();
  }
  return in_RDI;
}

Assistant:

NaVector&
NaVector::shift (int iOffset)
{
    int i;

    if(iOffset >= (int)dim() ||
       iOffset <= - (int)dim()){
       init_zero();
    }else if(iOffset > 0){
        for(i = dim() - iOffset - 1; i >= 0; --i){
            pVect[i + iOffset] = pVect[i];
        }
        for(i = 0; i < iOffset; ++i){
            pVect[i] = 0.0;
        }
    }else if(iOffset < 0){
        for(i = 0; i < (int)dim() + iOffset; ++i){
            pVect[i] = pVect[i - iOffset];
        }
        for(i = dim() + iOffset; i < (int)dim(); ++i){
            pVect[i] = 0.0;
        }
    }
    // else
    //   iOffset == 0
    
    return *this;
}